

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

duration<long,_boost::ratio<1L,_1L>_> __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>,unsigned_long>
::getAssignment<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (BruteForceSolver<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>,unsigned_long>
           *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map)

{
  reference puVar1;
  size_t col;
  size_t row;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  assignment_map_adapter;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map_local;
  BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
  *this_local;
  
  assignment_map_adapter.assignment_map_ = assignment_map;
  AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  AssignmentMapAdapter
            ((AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&row,assignment_map,*(unsigned_long *)(this + 0x18),*(unsigned_long *)(this + 0x20))
  ;
  for (col = 0; col < *(ulong *)(this + 0x18); col = col + 1) {
    puVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x40),col);
    if (*puVar1 < *(ulong *)(this + 0x20)) {
      AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::insert((AssignmentMapAdapter<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)&row,col,*puVar1);
    }
  }
  return (duration<long,_boost::ratio<1L,_1L>_>)*(rep *)(this + 0x88);
}

Assistant:

Cost getAssignment(AssignmentMap& assignment_map)
  {
    // Fill assignment map and compute total cost of assignment:
    AssignmentMapAdapter<Size, AssignmentMap> assignment_map_adapter(assignment_map, Size(num_rows_), Size(num_cols_));
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      const std::size_t col = optimal_assignment_[row];
      if (col < num_cols_)
      {
        assignment_map_adapter.insert(Size(row), Size(col));
      }
    }
    return optimal_cost_.second;
  }